

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_reader(reader *r)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  
  iVar1 = (*r->_vptr_reader[2])();
  poVar3 = std::operator<<((ostream *)jlog,"FIRST CHAR : ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar4 = 1;
  while( true ) {
    iVar2 = (*r->_vptr_reader[2])(r);
    if (iVar2 == -1) break;
    iVar1 = iVar1 + 1;
    iVar4 = iVar4 + 1;
  }
  poVar3 = std::operator<<((ostream *)jlog,"LENGTH : ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)jlog,"SUM    : ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void test_reader(reader &r)
{
    int sum = 0;
    int c = r.next();
    sum += c;
    jlog << "FIRST CHAR : " << c << endl;
    int n = 1;
    while ((c = r.next() != EOF))
    {
        sum += c;
        n++;
    }
    jlog << "LENGTH : " << n << endl;
    jlog << "SUM    : " << sum << endl;
}